

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

generic_param_guard __thiscall
cppwinrt::writer::push_generic_params
          (writer *this,pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *params)

{
  uint32_t uVar1;
  table_base *ptVar2;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *ppVar3;
  uint32_t uVar4;
  long *in_RDX;
  GenericParam __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  allocator<char> local_99;
  GenericParam local_98;
  writer *local_88;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string_view local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ptVar2 = (table_base *)in_RDX[2];
  uVar1 = *(uint32_t *)(in_RDX + 3);
  if (((table_base *)*in_RDX == ptVar2) && (*(uint32_t *)(in_RDX + 1) == uVar1)) {
    (this->super_writer_base<cppwinrt::writer>).m_second.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
  }
  else {
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super_row_base<winmd::reader::GenericParam>.m_table = (table_base *)*in_RDX;
    local_98.super_row_base<winmd::reader::GenericParam>._8_8_ = in_RDX[1];
    uVar4 = local_98.super_row_base<winmd::reader::GenericParam>.m_index;
    local_88 = this;
    local_80 = params;
    while ((ppVar3 = local_80,
           local_98.super_row_base<winmd::reader::GenericParam>.m_table != ptVar2 ||
           (uVar4 != uVar1))) {
      local_60 = winmd::reader::GenericParam::Name(&local_98);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_50,&local_60,&local_99);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      uVar4 = local_98.super_row_base<winmd::reader::GenericParam>.m_index + 1;
      local_98.super_row_base<winmd::reader::GenericParam>.m_index = uVar4;
    }
    std::
    vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
    ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                *)&local_80[4].first.super_row_base<winmd::reader::GenericParam>.m_index,&local_78);
    this = local_88;
    (local_88->super_writer_base<cppwinrt::writer>).m_second.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)ppVar3;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  return (generic_param_guard)this;
}

Assistant:

[[nodiscard]] auto push_generic_params(std::pair<GenericParam, GenericParam> const& params)
        {
            if (empty(params))
            {
                return generic_param_guard{ nullptr };
            }

            std::vector<std::string> names;

            for (auto&& param : params)
            {
                names.push_back(std::string{ param.Name() });
            }

            generic_param_stack.push_back(std::move(names));
            return generic_param_guard{ this };
        }